

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_ping.c
# Opt level: O0

ssize_t tnt_ping(tnt_stream *s)

{
  uint64_t sync;
  char *pcVar1;
  ssize_t sVar2;
  char *len_end;
  char len_prefix [9];
  int i;
  size_t package_len;
  char *pcStack_78;
  char body [2];
  char *data;
  undefined1 auStack_68 [4];
  int v_sz;
  iovec v [3];
  tnt_iheader hdr;
  tnt_stream *s_local;
  
  pcStack_78 = (char *)0x0;
  sync = s->reqid;
  s->reqid = sync + 1;
  encode_header((tnt_iheader *)&v[2].iov_len,0x40,sync);
  v[0].iov_len = (size_t)&v[2].iov_len;
  v[1].iov_base = (void *)(hdr._24_8_ - (long)&v[2].iov_len);
  pcStack_78 = (char *)((long)&package_len + 6);
  pcStack_78 = mp_encode_map(pcStack_78,0);
  v[1].iov_len = (long)&package_len + 6;
  v[2].iov_base = pcStack_78 + -((long)&package_len + 6);
  stack0xffffffffffffff78 = 0;
  len_prefix[1] = '\x01';
  len_prefix[2] = '\0';
  len_prefix[3] = '\0';
  len_prefix[4] = '\0';
  for (; (int)len_prefix._1_4_ < 3; len_prefix._1_4_ = len_prefix._1_4_ + 1) {
    register0x00000000 = (long)v[(int)len_prefix._1_4_].iov_base + stack0xffffffffffffff78;
  }
  pcVar1 = mp_encode_luint32((char *)((long)&len_end + 3),stack0xffffffffffffff78);
  _auStack_68 = (void *)((long)&len_end + 3);
  v[0].iov_base = pcVar1 + -((long)&len_end + 3);
  sVar2 = (*s->writev)(s,(iovec *)auStack_68,3);
  return sVar2;
}

Assistant:

ssize_t
tnt_ping(struct tnt_stream *s)
{
	struct tnt_iheader hdr;
	struct iovec v[3]; int v_sz = 3;
	char *data = NULL;
	encode_header(&hdr, TNT_OP_PING, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[2]; data = body;

	data = mp_encode_map(data, 0);
	v[2].iov_base = body;
	v[2].iov_len  = data - body;

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i)
		package_len += v[i].iov_len;
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}